

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
SummizerTestGlobal7_CanSumGlobal7_Test::TestBody(SummizerTestGlobal7_CanSumGlobal7_Test *this)

{
  unique_ptr<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_> this_00;
  int iVar1;
  pointer __p;
  TypedExpectation<int_(int,_int,_int,_int,_int,_int,_int)> *this_01;
  MatcherBase<int> local_178;
  MatcherBase<int> local_160;
  MatcherBase<int> local_148;
  MatcherBase<int> local_130;
  MatcherBase<int> local_118;
  MatcherBase<int> local_100;
  MatcherBase<int> local_e8;
  MockSpec<int_(int,_int,_int,_int,_int,_int,_int)> local_d0;
  
  if ((__uniq_ptr_impl<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_>)
      gmock_globalmock_sum7_instance._M_t.
      super___uniq_ptr_impl<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_>._M_t
      .super__Tuple_impl<0UL,_gmock_globalmock_sum7_*,_std::default_delete<gmock_globalmock_sum7>_>.
      super__Head_base<0UL,_gmock_globalmock_sum7_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_>)0x0) {
    iVar1 = strcmp(*(char **)gmock_globalmock_sum7_instance._M_t.
                             super___uniq_ptr_impl<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gmock_globalmock_sum7_*,_std::default_delete<gmock_globalmock_sum7>_>
                             .super__Head_base<0UL,_gmock_globalmock_sum7_*,_false>._M_head_impl,
                   "TestBody");
    if (iVar1 == 0) goto LAB_00110b8c;
  }
  __p = (pointer)operator_new(0x50);
  __p->m_tag = "TestBody";
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(__p->gmock7_sum7_29).super_UntypedFunctionMockerBase);
  (__p->gmock7_sum7_29).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00191810;
  std::__uniq_ptr_impl<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_>::reset
            ((__uniq_ptr_impl<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_> *)
             &gmock_globalmock_sum7_instance,__p);
LAB_00110b8c:
  this_00._M_t.
  super___uniq_ptr_impl<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_>._M_t.
  super__Tuple_impl<0UL,_gmock_globalmock_sum7_*,_std::default_delete<gmock_globalmock_sum7>_>.
  super__Head_base<0UL,_gmock_globalmock_sum7_*,_false>._M_head_impl =
       gmock_globalmock_sum7_instance._M_t.
       super___uniq_ptr_impl<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_>.
       _M_t.
       super__Tuple_impl<0UL,_gmock_globalmock_sum7_*,_std::default_delete<gmock_globalmock_sum7>_>.
       super__Head_base<0UL,_gmock_globalmock_sum7_*,_false>._M_head_impl;
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_130,1);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_148,2);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_160,3);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_178,4);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_e8,5);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_100,6);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_118,7);
  gmock_globalmock_sum7::gmock_sum7
            (&local_d0,
             (gmock_globalmock_sum7 *)
             this_00._M_t.
             super___uniq_ptr_impl<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmock_globalmock_sum7_*,_std::default_delete<gmock_globalmock_sum7>_>
             .super__Head_base<0UL,_gmock_globalmock_sum7_*,_false>._M_head_impl,
             (Matcher<int> *)&local_130,(Matcher<int> *)&local_148,(Matcher<int> *)&local_160,
             (Matcher<int> *)&local_178,(Matcher<int> *)&local_e8,(Matcher<int> *)&local_100,
             (Matcher<int> *)&local_118);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<int_(int,_int,_int,_int,_int,_int,_int)>::InternalExpectedAt
                      (&local_d0,
                       "/workspace/llm4binary/github/license_c_cmakelists/apriorit[P]gmock-global/sample/main.cpp"
                       ,0x72,"*gmock_globalmock_sum7_instance","sum7(1, 2, 3, 4, 5, 6, 7)");
  testing::internal::TypedExpectation<int_(int,_int,_int,_int,_int,_int,_int)>::Times(this_01,1);
  testing::internal::MatcherBase<int>::~MatcherBase
            ((MatcherBase<int> *)
             &local_d0.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
              .super__Head_base<0UL,_testing::Matcher<int>,_false>);
  testing::internal::MatcherBase<int>::~MatcherBase
            ((MatcherBase<int> *)
             &local_d0.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
              .super__Head_base<1UL,_testing::Matcher<int>,_false>);
  testing::internal::MatcherBase<int>::~MatcherBase
            ((MatcherBase<int> *)
             &local_d0.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
              .super__Head_base<2UL,_testing::Matcher<int>,_false>);
  testing::internal::MatcherBase<int>::~MatcherBase
            ((MatcherBase<int> *)
             ((long)&local_d0.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                     .
                     super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                     .
                     super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                     .
                     super__Tuple_impl<3UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
             + 0x48));
  testing::internal::MatcherBase<int>::~MatcherBase
            ((MatcherBase<int> *)
             ((long)&local_d0.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                     .
                     super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                     .
                     super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                     .
                     super__Tuple_impl<3UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
             + 0x30));
  testing::internal::MatcherBase<int>::~MatcherBase
            ((MatcherBase<int> *)
             ((long)&local_d0.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                     .
                     super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                     .
                     super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                     .
                     super__Tuple_impl<3UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
             + 0x18));
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_d0.matchers_);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_118);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_100);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_e8);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_178);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_160);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_148);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_130);
  sum7(1,2,3,4,5,6,7);
  std::__uniq_ptr_impl<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_>::reset
            ((__uniq_ptr_impl<gmock_globalmock_sum7,_std::default_delete<gmock_globalmock_sum7>_> *)
             &gmock_globalmock_sum7_instance,(pointer)0x0);
  return;
}

Assistant:

TEST(SummizerTestGlobal1, ExceptionOnCallWithoutExpect)
{
    ASSERT_ANY_THROW(sum1(0));
}